

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * __thiscall
CLI::App::help(string *__return_storage_ptr__,App *this,string *prev,AppFormatMode mode)

{
  pointer *pppAVar1;
  pointer pcVar2;
  App *this_00;
  element_type *peVar3;
  long *plVar4;
  pointer *pppAVar5;
  _Alloc_hider _Var6;
  pointer *pppAVar7;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> selected_subcommands;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> local_b0;
  long lStack_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  string local_70;
  pointer *local_50 [2];
  pointer local_40 [2];
  
  if (prev->_M_string_length == 0) {
    pppAVar7 = &local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    pcVar2 = (this->name_)._M_dataplus._M_p;
    local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)pppAVar7;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar2,pcVar2 + (this->name_)._M_string_length);
    ::std::__cxx11::string::operator=((string *)prev,(string *)&local_b0);
    pppAVar5 = (pointer *)
               local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  else {
    pppAVar7 = local_40;
    pcVar2 = (this->name_)._M_dataplus._M_p;
    local_50[0] = pppAVar7;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar2,pcVar2 + (this->name_)._M_string_length);
    plVar4 = (long *)::std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x15c15e);
    pppAVar1 = &local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    pppAVar5 = (pointer *)(plVar4 + 2);
    if ((pointer *)*plVar4 == pppAVar5) {
      local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *pppAVar5;
      lStack_98 = plVar4[3];
      local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pppAVar1;
    }
    else {
      local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *pppAVar5;
      local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar4;
    }
    local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar4[1];
    *plVar4 = (long)pppAVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)prev,
               (ulong)local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    pppAVar5 = local_50[0];
    if (local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)pppAVar1) {
      operator_delete(local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
      pppAVar5 = local_50[0];
    }
  }
  if (pppAVar5 != pppAVar7) {
    operator_delete(pppAVar5);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector(&local_b0,&this->parsed_subcommands_)
  ;
  if (local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    peVar3 = (this->formatter_).super___shared_ptr<CLI::FormatterBase,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    pcVar2 = (prev->_M_dataplus)._M_p;
    local_90[0] = &local_80;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar2,pcVar2 + prev->_M_string_length);
    (*peVar3->_vptr_FormatterBase[2])(__return_storage_ptr__,peVar3,this,local_90,(ulong)mode);
    _Var6._M_p = (pointer)local_90[0];
    if (local_90[0] == &local_80) goto LAB_0014db38;
  }
  else {
    this_00 = *local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    pcVar2 = (prev->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + prev->_M_string_length);
    help(__return_storage_ptr__,this_00,&local_70,mode);
    _Var6._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0014db38;
  }
  operator_delete(_Var6._M_p);
LAB_0014db38:
  if (local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string help(std::string prev = "", AppFormatMode mode = AppFormatMode::Normal) const {
        if(prev.empty())
            prev = get_name();
        else
            prev += " " + get_name();

        // Delegate to subcommand if needed
        auto selected_subcommands = get_subcommands();
        if(!selected_subcommands.empty())
            return selected_subcommands.at(0)->help(prev, mode);
        else
            return formatter_->make_help(this, prev, mode);
    }